

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall testing::FormatCxxExceptionMessage(testing *this,char *description,char *location)

{
  size_t sVar1;
  long lVar2;
  size_t extraout_RDX;
  char *pcVar4;
  ostream *poVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar6;
  String SVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Message message;
  size_t sVar3;
  
  Message::Message((Message *)&local_30);
  poVar5 = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  if (description == (char *)0x0) {
    lVar2 = 0x15;
    pcVar4 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"C++ exception with description \"",0x20);
    poVar5 = (ostream *)(local_30.ptr_ + 0x10);
    if (local_30.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,description,sVar1);
    poVar5 = (ostream *)(local_30.ptr_ + 0x10);
    if (local_30.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    lVar2 = 1;
    pcVar4 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar2);
  poVar5 = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," thrown in ",0xb);
  if (location == (char *)0x0) {
    sVar6.ptr_ = local_30.ptr_ + 0x10;
    sVar1 = 6;
    location = "(null)";
  }
  else {
    sVar6.ptr_ = local_30.ptr_;
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar6.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_30.ptr_ + 0x10);
    }
    sVar1 = strlen(location);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar6.ptr_,location,sVar1);
  poVar5 = (ostream *)(local_30.ptr_ + 0x10);
  if (local_30.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  SVar7 = internal::StringStreamToString((internal *)this,local_30.ptr_);
  sVar3 = SVar7.length_;
  if (local_30.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
    sVar3 = extraout_RDX;
  }
  SVar7.length_ = sVar3;
  SVar7.c_str_ = (char *)this;
  return SVar7;
}

Assistant:

static internal::String FormatCxxExceptionMessage(const char* description,
                                                  const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}